

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_memory.c
# Opt level: O0

int pageProtect(void *ptr,size_t bytes,int rules,char **errfunc)

{
  int iVar1;
  int *piVar2;
  undefined8 *in_RCX;
  int in_EDX;
  size_t in_RSI;
  void *in_RDI;
  int local_4;
  
  iVar1 = mprotect(in_RDI,in_RSI,in_EDX);
  if (iVar1 == -1) {
    *in_RCX = "mprotect";
    piVar2 = __errno_location();
    local_4 = *piVar2;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static inline int pageProtect(void* ptr, size_t bytes, int rules, char **errfunc) {
#if defined(_WIN32) || defined(__CYGWIN__)
	DWORD oldp;
	if (!VirtualProtect(ptr, bytes, (DWORD)rules, &oldp)) {
		Fail("VirtualProtect");
	}
#else
	if (-1 == mprotect(ptr, bytes, rules))
		Fail("mprotect");
#endif
	return 0;
}